

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack21_24(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [32];
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar12 [64];
  
  auVar1 = *(undefined1 (*) [32])(in + 1);
  auVar7 = vpmovsxbd_avx512f(_DAT_001944c0);
  uVar2 = *in;
  auVar4 = vpsllvd_avx2(auVar1,_DAT_001911a0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(in + 10);
  auVar6 = vpsllvd_avx2(auVar6,_DAT_00194460);
  auVar4 = vpand_avx2(auVar4,_DAT_001911c0);
  *out = uVar2 & 0x1fffff;
  auVar7 = vpermi2d_avx512f(auVar7,ZEXT3264(auVar1),ZEXT464(uVar2));
  auVar8 = vpmovsxbd_avx512f(_DAT_001944d0);
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(in + 9);
  auVar16 = vpsrlvd_avx2(auVar16,_DAT_00194450);
  auVar7 = vpermi2d_avx512f(auVar8,auVar7,ZEXT864(*(ulong *)(in + 9)));
  auVar8 = vpmovsxbd_avx512f(_DAT_001944e0);
  auVar7 = vpermt2q_avx512f(auVar7,auVar9,ZEXT1664(auVar6));
  auVar8 = vpermd_avx512f(auVar8,auVar7);
  auVar8 = vpsrlvd_avx512f(auVar8,_DAT_001a3d00);
  auVar10 = vmovdqa64_avx512f(auVar8);
  auVar7 = vpandd_avx512f(auVar7,_DAT_001a3d40);
  auVar10._56_4_ = auVar7._56_4_;
  auVar10._60_4_ = auVar7._60_4_;
  auVar7 = vpmovsxbd_avx512f(_DAT_001944f0);
  auVar7 = vpermd_avx512f(auVar7,ZEXT3264(auVar4));
  auVar11 = vpbroadcastd_avx512f(ZEXT416(0x1fffff));
  auVar12 = vpbroadcastd_avx512f();
  auVar13._0_48_ = auVar7._0_48_;
  auVar13._48_4_ = auVar12._48_4_;
  auVar13._52_4_ = auVar7._52_4_;
  auVar13._56_4_ = auVar7._56_4_;
  auVar13._60_4_ = auVar7._60_4_;
  auVar7 = vpermt2q_avx512f(auVar13,auVar9,ZEXT1664(auVar16));
  uVar2 = in[0xb];
  uVar3 = *(ulong *)(in + 0xe);
  auVar7 = vpord_avx512f(auVar10,auVar7);
  auVar8 = vpandd_avx512f(auVar8,auVar11);
  auVar9._4_4_ = auVar8._4_4_;
  auVar9._0_4_ = auVar7._0_4_;
  auVar9._8_4_ = auVar7._8_4_;
  auVar9._12_4_ = auVar7._12_4_;
  auVar9._16_4_ = auVar8._16_4_;
  auVar9._20_4_ = auVar7._20_4_;
  auVar9._24_4_ = auVar7._24_4_;
  auVar9._28_4_ = auVar8._28_4_;
  auVar9._32_4_ = auVar7._32_4_;
  auVar9._36_4_ = auVar7._36_4_;
  auVar9._40_4_ = auVar8._40_4_;
  auVar9._44_4_ = auVar7._44_4_;
  auVar9._48_4_ = auVar7._48_4_;
  auVar9._52_4_ = auVar8._52_4_;
  auVar9._56_4_ = auVar7._56_4_;
  auVar9._60_4_ = auVar7._60_4_;
  auVar7 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])(out + 1) = auVar7;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(in + 0xc);
  auVar6 = vshufps_avx(ZEXT416(uVar2),auVar14,0x40);
  auVar16 = vpsrlvd_avx2(auVar6,_DAT_001a1510);
  auVar6 = vshufps_avx(auVar14,auVar14,0x50);
  auVar6 = vpsllvd_avx2(auVar6,_DAT_001a1520);
  auVar5 = vpternlogd_avx512vl(auVar6,auVar16,_DAT_001a1530,0xec);
  auVar6 = vpand_avx(auVar16,auVar11._0_16_);
  auVar16 = vpblendd_avx2(auVar6,auVar5,6);
  auVar6 = vpmovsxbd_avx(ZEXT416(0x401));
  *(undefined1 (*) [16])(out + 0x11) = auVar16;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar3;
  auVar6 = vpermi2d_avx512vl(auVar6,auVar14,auVar15);
  auVar16 = vpsrlvd_avx2(auVar6,_DAT_001a1540);
  auVar6 = vpsllvd_avx2(auVar15,_DAT_001952a0);
  auVar5._8_8_ = 0x1c0000001fff80;
  auVar5._0_8_ = 0x1c0000001fff80;
  auVar6 = vpternlogq_avx512vl(auVar6,auVar16,auVar5,0xec);
  *(long *)(out + 0x15) = auVar6._0_8_;
  out[0x17] = (uint)(uVar3 >> 0x23) & 0x1fffff;
  return in + 0x10;
}

Assistant:

const uint32_t *__fastunpack21_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 10)) << (21 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 21);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 20)) << (21 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 9)) << (21 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 21);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 19)) << (21 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 8)) << (21 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 21);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 18)) << (21 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 7)) << (21 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 21);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 17)) << (21 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 6)) << (21 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 21);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 16)) << (21 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 5)) << (21 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 21);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 15)) << (21 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 4)) << (21 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 21);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 14)) << (21 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 3)) << (21 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 21);
  out++;

  return in + 1;
}